

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O3

void __thiscall
brotli::Command::Command
          (Command *this,size_t insertlen,size_t copylen,size_t copylen_code,size_t distance_code)

{
  int iVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ushort uVar7;
  uint uVar8;
  bool bVar9;
  
  uVar6 = (uint)insertlen;
  this->insert_len_ = uVar6;
  this->copy_len_ = (uint32_t)copylen;
  uVar4 = 0;
  if (0xf < distance_code) {
    uVar4 = 0x1f;
    uVar5 = (uint)(distance_code - 0xc);
    if (uVar5 != 0) {
      for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = (uVar4 ^ 0xffffffe0) + 0x1f;
    bVar9 = (distance_code - 0xc >> ((ulong)uVar4 & 0x3f) & 1) != 0;
    distance_code = (ulong)bVar9 + (ulong)uVar4 * 2 + 0x1000e;
    uVar4 = uVar5 - ((bVar9 | 2) << ((byte)uVar4 & 0x3f)) | uVar4 * 0x1000000;
  }
  this->dist_prefix_ = (uint16_t)distance_code;
  this->dist_extra_ = uVar4;
  if (5 < insertlen) {
    if (insertlen < 0x82) {
      uVar4 = 0x1f;
      uVar6 = (uint)(insertlen - 2);
      if (uVar6 != 0) {
        for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar6 = (int)(insertlen - 2 >> ((char)(uVar4 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
              (uVar4 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (insertlen < 0x842) {
      uVar4 = 0x1f;
      if (uVar6 - 0x42 != 0) {
        for (; uVar6 - 0x42 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar6 = (uVar4 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar6 = 0x15;
      if (0x1841 < insertlen) {
        uVar6 = (uint)(ushort)(0x17 - (insertlen < 0x5842));
      }
    }
  }
  if (copylen_code < 10) {
    uVar4 = (int)copylen_code - 2;
  }
  else if (copylen_code < 0x86) {
    uVar4 = 0x1f;
    uVar5 = (uint)(copylen_code - 6);
    if (uVar5 != 0) {
      for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = (int)(copylen_code - 6 >> ((char)(uVar4 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
            (uVar4 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar4 = 0x17;
    if (copylen_code < 0x846) {
      uVar5 = (int)copylen_code - 0x46;
      uVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = (uVar4 ^ 0xffe0) + 0x2c;
    }
  }
  uVar8 = (uVar6 & 0xffff) * 4;
  uVar5 = (uVar4 & 0xffff) * 4;
  uVar3 = (ushort)uVar4;
  iVar1 = *(int *)(kInsExtra + uVar8);
  iVar2 = *(int *)(kCopyExtra + uVar5);
  uVar8 = *(uint *)(kInsBase + uVar8);
  uVar5 = *(uint *)(kCopyBase + uVar5);
  uVar7 = (uVar3 & 7) + ((ushort)uVar6 & 7) * 8;
  if ((((uint16_t)distance_code == 0) && ((ushort)uVar6 < 8)) && (uVar3 < 0x10)) {
    if (7 < uVar3) {
      uVar7 = uVar7 | 0x40;
    }
  }
  else {
    uVar7 = uVar7 | *(ushort *)
                     (CombineLengthCodes(unsigned_short,unsigned_short,bool)::cells +
                     (ulong)(((uVar6 & 0xffff) >> 3) * 3 + ((uVar4 & 0xffff) >> 3)) * 2);
  }
  this->cmd_prefix_ = uVar7;
  this->cmd_extra_ =
       copylen_code - uVar5 << ((byte)iVar1 & 0x3f) |
       (ulong)(uint)(iVar2 + iVar1) << 0x30 | insertlen - uVar8;
  return;
}

Assistant:

Command(size_t insertlen, size_t copylen, size_t copylen_code,
          size_t distance_code)
      : insert_len_(static_cast<uint32_t>(insertlen))
      , copy_len_(static_cast<uint32_t>(copylen)) {
    // The distance prefix and extra bits are stored in this Command as if
    // npostfix and ndirect were 0, they are only recomputed later after the
    // clustering if needed.
    PrefixEncodeCopyDistance(distance_code, 0, 0, &dist_prefix_, &dist_extra_);
    GetLengthCode(insertlen, copylen_code, dist_prefix_ == 0,
                  &cmd_prefix_, &cmd_extra_);
  }